

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

Interval * tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc1 *func,Interval *arg0)

{
  double dVar1;
  bool bVar2;
  deRoundingMode dVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar13 = arg0->m_lo;
  if (dVar13 < arg0->m_hi || dVar13 == arg0->m_hi) {
    dVar3 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar5 = (*func)(dVar13);
    dVar11 = dVar5;
    if (NAN(dVar5)) {
      dVar11 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar6 = (*func)(dVar13);
    dVar13 = dVar6;
    if (NAN(dVar6)) {
      dVar13 = INFINITY;
    }
    deSetRoundingMode(dVar3);
    dVar12 = arg0->m_hi;
    dVar3 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar7 = (*func)(dVar12);
    dVar8 = dVar7;
    if (NAN(dVar7)) {
      dVar8 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar9 = (*func)(dVar12);
    deSetRoundingMode(dVar3);
    dVar1 = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar5 | -(ulong)NAN(dVar5) & 0xfff0000000000000);
    dVar12 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | -(ulong)NAN(dVar6) & 0xfff0000000000000);
    uVar4 = -(ulong)(dVar12 <= dVar1);
    dVar10 = (double)(-(ulong)(dVar11 <= dVar13) & (ulong)dVar11 |
                     ~-(ulong)(dVar11 <= dVar13) & (ulong)dVar13);
    dVar11 = (double)(uVar4 & (ulong)dVar1 | ~uVar4 & (ulong)dVar12);
    dVar13 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 | -(ulong)NAN(dVar7) & 0xfff0000000000000);
    dVar12 = dVar9;
    if (NAN(dVar9)) {
      dVar12 = -INFINITY;
    }
    uVar4 = -(ulong)(dVar12 <= dVar13);
    dVar12 = (double)(uVar4 & (ulong)dVar13 | ~uVar4 & (ulong)dVar12);
    dVar13 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0x7ff0000000000000);
    uVar4 = -(ulong)(dVar8 <= dVar13);
    dVar13 = (double)(uVar4 & (ulong)dVar8 | ~uVar4 & (ulong)dVar13);
    bVar2 = (bool)((-(NAN(dVar5) || NAN(dVar6)) | -(NAN(dVar7) || NAN(dVar9))) & 1);
    uVar4 = -(ulong)(dVar10 <= dVar13);
    dVar5 = (double)(uVar4 & (ulong)dVar10 | ~uVar4 & (ulong)dVar13);
    uVar4 = -(ulong)(dVar12 <= dVar11);
    dVar13 = (double)(uVar4 & (ulong)dVar11 | ~uVar4 & (ulong)dVar12);
  }
  else {
    dVar13 = -INFINITY;
    dVar5 = INFINITY;
    bVar2 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar2;
  __return_storage_ptr__->m_lo = dVar5;
  __return_storage_ptr__->m_hi = dVar13;
  if (arg0->m_hasNaN == true) {
    dVar13 = __return_storage_ptr__->m_lo;
    dVar11 = __return_storage_ptr__->m_hi;
    if (INFINITY <= dVar13) {
      dVar13 = INFINITY;
    }
    if (dVar11 <= -INFINITY) {
      dVar11 = -INFINITY;
    }
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar13;
    __return_storage_ptr__->m_hi = dVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc1& func, const Interval& arg0)
{
	Interval ret;
	TCU_INTERVAL_APPLY_MONOTONE1(ret, x, arg0, val,
								 TCU_SET_INTERVAL(val, point, point = func(x)));
	return ret;
}